

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.hpp
# Opt level: O3

string * __thiscall
duckdb::StringUtil::Format<std::__cxx11::string,char_const*>
          (string *__return_storage_ptr__,StringUtil *this,string *fmt_str,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,char *params_1)

{
  pointer pcVar1;
  string local_48;
  
  pcVar1 = (fmt_str->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + fmt_str->_M_string_length);
  Exception::ConstructMessage<std::__cxx11::string,char_const*>
            (__return_storage_ptr__,(Exception *)this,&local_48,params,params_1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

static string Format(const string fmt_str, ARGS... params) {
		return Exception::ConstructMessage(fmt_str, params...);
	}